

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O0

Image<unsigned_char> * __thiscall
ObjLoader::NamedTextureImages::operator[](NamedTextureImages *this,string *name)

{
  bool bVar1;
  int iVar2;
  pointer pvVar3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_true>
  local_38;
  const_iterator searchRes;
  string *name_local;
  NamedTextureImages *this_local;
  
  if (operator[](std::__cxx11::string_const&)::defaultImage == '\0') {
    iVar2 = __cxa_guard_acquire(&operator[](std::__cxx11::string_const&)::defaultImage);
    if (iVar2 != 0) {
      Image<unsigned_char>::Image(&operator[]::defaultImage,white,1,1,4);
      __cxa_guard_release(&operator[](std::__cxx11::string_const&)::defaultImage);
    }
  }
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>_>
       ::find(&this->m_images,name);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>_>
       ::end(&this->m_images);
  bVar1 = std::__detail::operator==(&local_38,&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_local = (NamedTextureImages *)&operator[]::defaultImage;
  }
  else {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_false,_true>
                           *)&local_38);
    this_local = (NamedTextureImages *)&pvVar3->second;
  }
  return (Image<unsigned_char> *)this_local;
}

Assistant:

const Image<> & ObjLoader::NamedTextureImages::operator[](const std::string & name) const
{
  static Image<> defaultImage(white, 1, 1, 4);
  auto searchRes = m_images.find(name);
  if (searchRes != m_images.end()) {
    return searchRes->second;
  }
  return defaultImage;
}